

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  undefined8 *puVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  Geometry *pGVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  uint uVar29;
  ulong *puVar30;
  undefined1 (*pauVar31) [16];
  undefined4 uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  RTCIntersectArguments *pRVar37;
  ulong uVar38;
  long lVar39;
  Scene *pSVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  float fVar54;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar53;
  undefined1 auVar52 [64];
  float fVar55;
  float fVar68;
  float fVar69;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar70;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar79;
  undefined1 auVar78 [32];
  float fVar98;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar99;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar100;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar101;
  float fVar111;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar102;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [16];
  float fVar112;
  undefined1 auVar106 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar143 [16];
  float fVar138;
  float fVar152;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar150;
  float fVar151;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [64];
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar164 [64];
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [64];
  float fVar173;
  undefined1 auVar174 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar175 [64];
  float fVar179;
  float fVar180;
  undefined1 auVar181 [16];
  float fVar188;
  undefined1 auVar182 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar189;
  undefined1 auVar183 [64];
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar191 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26e9;
  undefined1 (*local_26e8) [16];
  ulong local_26e0;
  Scene *local_26d8;
  undefined8 local_26d0;
  float fStack_26c8;
  float fStack_26c4;
  ulong local_26c0;
  RayHit *local_26b8;
  RayQueryContext *local_26b0;
  int local_26a4;
  undefined1 local_26a0 [8];
  float fStack_2698;
  float fStack_2694;
  undefined8 local_2690;
  float fStack_2688;
  float fStack_2684;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  long local_2650;
  long local_2648;
  RTCFilterFunctionNArguments local_2640;
  float local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined4 local_2604;
  undefined4 local_2600;
  undefined4 local_25fc;
  uint local_25f8;
  uint local_25f4;
  uint local_25f0;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [16];
  undefined1 *local_2590;
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined1 local_24a0 [16];
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar36;
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_26e8 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar56 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar94 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar93._8_4_ = 0x7fffffff;
    auVar93._0_8_ = 0x7fffffff7fffffff;
    auVar93._12_4_ = 0x7fffffff;
    auVar93 = vandps_avx((undefined1  [16])aVar3,auVar93);
    auVar113._8_4_ = 0x219392ef;
    auVar113._0_8_ = 0x219392ef219392ef;
    auVar113._12_4_ = 0x219392ef;
    auVar93 = vcmpps_avx(auVar93,auVar113,1);
    auVar93 = vblendvps_avx((undefined1  [16])aVar3,auVar113,auVar93);
    auVar113 = vrcpps_avx(auVar93);
    fVar18 = auVar113._0_4_;
    auVar80._0_4_ = auVar93._0_4_ * fVar18;
    fVar19 = auVar113._4_4_;
    auVar80._4_4_ = auVar93._4_4_ * fVar19;
    fVar20 = auVar113._8_4_;
    auVar80._8_4_ = auVar93._8_4_ * fVar20;
    fVar21 = auVar113._12_4_;
    auVar80._12_4_ = auVar93._12_4_ * fVar21;
    auVar114._8_4_ = 0x3f800000;
    auVar114._0_8_ = 0x3f8000003f800000;
    auVar114._12_4_ = 0x3f800000;
    auVar93 = vsubps_avx(auVar114,auVar80);
    auVar81._0_4_ = fVar18 + fVar18 * auVar93._0_4_;
    auVar81._4_4_ = fVar19 + fVar19 * auVar93._4_4_;
    auVar81._8_4_ = fVar20 + fVar20 * auVar93._8_4_;
    auVar81._12_4_ = fVar21 + fVar21 * auVar93._12_4_;
    uVar32 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar32;
    local_23e0._0_4_ = uVar32;
    local_23e0._8_4_ = uVar32;
    local_23e0._12_4_ = uVar32;
    local_23e0._16_4_ = uVar32;
    local_23e0._20_4_ = uVar32;
    local_23e0._24_4_ = uVar32;
    local_23e0._28_4_ = uVar32;
    auVar159 = ZEXT3264(local_23e0);
    uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar32;
    local_2400._0_4_ = uVar32;
    local_2400._8_4_ = uVar32;
    local_2400._12_4_ = uVar32;
    local_2400._16_4_ = uVar32;
    local_2400._20_4_ = uVar32;
    local_2400._24_4_ = uVar32;
    local_2400._28_4_ = uVar32;
    auVar164 = ZEXT3264(local_2400);
    uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar32;
    local_2420._0_4_ = uVar32;
    local_2420._8_4_ = uVar32;
    local_2420._12_4_ = uVar32;
    local_2420._16_4_ = uVar32;
    local_2420._20_4_ = uVar32;
    local_2420._24_4_ = uVar32;
    local_2420._28_4_ = uVar32;
    auVar169 = ZEXT3264(local_2420);
    auVar93 = vshufps_avx(auVar81,auVar81,0);
    local_2440._16_16_ = auVar93;
    local_2440._0_16_ = auVar93;
    auVar175 = ZEXT3264(local_2440);
    auVar93 = vmovshdup_avx(auVar81);
    auVar113 = vshufps_avx(auVar81,auVar81,0x55);
    local_2460._16_16_ = auVar113;
    local_2460._0_16_ = auVar113;
    auVar183 = ZEXT3264(local_2460);
    auVar113 = vshufpd_avx(auVar81,auVar81,1);
    auVar80 = vshufps_avx(auVar81,auVar81,0xaa);
    local_2480._16_16_ = auVar80;
    local_2480._0_16_ = auVar80;
    auVar191 = ZEXT3264(local_2480);
    uVar41 = (ulong)(auVar81._0_4_ < 0.0) << 3;
    uVar36 = (ulong)(auVar93._0_4_ < 0.0) * 8 + 0x10;
    uVar33 = (ulong)(auVar113._0_4_ < 0.0);
    lVar1 = uVar33 * 8;
    auVar93 = vshufps_avx(auVar56,auVar56,0);
    local_23c0._16_16_ = auVar93;
    local_23c0._0_16_ = auVar93;
    auVar93 = vshufps_avx(auVar94,auVar94,0);
    auVar52 = ZEXT3264(CONCAT1616(auVar93,auVar93));
    uVar42 = uVar41 ^ 8;
    uVar44 = uVar36 ^ 8;
    uVar38 = lVar1 + 0x20U ^ 8;
    local_25e0 = mm_lookupmask_ps._240_8_;
    uStack_25d8 = mm_lookupmask_ps._248_8_;
    local_26e0 = uVar36;
    local_26c0 = uVar41;
    local_26b8 = ray;
    local_26b0 = context;
LAB_00e72257:
    if (local_26e8 != (undefined1 (*) [16])&local_23a0) {
      pauVar31 = local_26e8 + -1;
      local_26e8 = local_26e8 + -1;
      if (*(float *)(*pauVar31 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar34 = *(ulong *)*local_26e8;
        while ((uVar34 & 8) == 0) {
          uVar43 = uVar34 & 0xfffffffffffffff0;
          puVar30 = (ulong *)(uVar43 + 0x40);
          if (uVar43 == 0) {
            puVar30 = (ulong *)0x0;
          }
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *puVar30;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = puVar30[1];
          auVar93 = vpminub_avx(auVar56,auVar82);
          auVar93 = vpcmpeqb_avx(auVar56,auVar93);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)((long)puVar30 + 4);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)puVar30 + 0xc);
          auVar56 = vpminub_avx(auVar94,auVar103);
          auVar56 = vpcmpeqb_avx(auVar94,auVar56);
          fVar18 = *(float *)(puVar30 + 6);
          fVar19 = *(float *)((long)puVar30 + 0x3c);
          auVar83._8_8_ = 0;
          auVar83._0_8_ = *(ulong *)((long)puVar30 + uVar41);
          auVar94 = vpmovzxbd_avx(auVar83);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)((long)puVar30 + uVar41 + 4);
          auVar113 = vpmovzxbd_avx(auVar122);
          auVar96._16_16_ = auVar113;
          auVar96._0_16_ = auVar94;
          auVar96 = vcvtdq2ps_avx(auVar96);
          auVar97._0_4_ = fVar18 + fVar19 * auVar96._0_4_;
          auVar97._4_4_ = fVar18 + fVar19 * auVar96._4_4_;
          auVar97._8_4_ = fVar18 + fVar19 * auVar96._8_4_;
          auVar97._12_4_ = fVar18 + fVar19 * auVar96._12_4_;
          auVar97._16_4_ = fVar18 + fVar19 * auVar96._16_4_;
          auVar97._20_4_ = fVar18 + fVar19 * auVar96._20_4_;
          auVar97._24_4_ = fVar18 + fVar19 * auVar96._24_4_;
          auVar97._28_4_ = fVar18 + auVar96._28_4_;
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)((long)puVar30 + uVar42);
          auVar94 = vpmovzxbd_avx(auVar123);
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)((long)puVar30 + uVar42 + 4);
          auVar113 = vpmovzxbd_avx(auVar129);
          auVar127._16_16_ = auVar113;
          auVar127._0_16_ = auVar94;
          auVar96 = vcvtdq2ps_avx(auVar127);
          auVar106._0_4_ = fVar18 + fVar19 * auVar96._0_4_;
          auVar106._4_4_ = fVar18 + fVar19 * auVar96._4_4_;
          auVar106._8_4_ = fVar18 + fVar19 * auVar96._8_4_;
          auVar106._12_4_ = fVar18 + fVar19 * auVar96._12_4_;
          auVar106._16_4_ = fVar18 + fVar19 * auVar96._16_4_;
          auVar106._20_4_ = fVar18 + fVar19 * auVar96._20_4_;
          auVar106._24_4_ = fVar18 + fVar19 * auVar96._24_4_;
          auVar106._28_4_ = fVar18 + fVar19;
          fVar18 = *(float *)((long)puVar30 + 0x34);
          fVar19 = *(float *)(puVar30 + 8);
          auVar115._8_8_ = 0;
          auVar115._0_8_ = *(ulong *)((long)puVar30 + uVar36);
          auVar94 = vpmovzxbd_avx(auVar115);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)((long)puVar30 + uVar36 + 4);
          auVar113 = vpmovzxbd_avx(auVar139);
          auVar120._16_16_ = auVar113;
          auVar120._0_16_ = auVar94;
          auVar96 = vcvtdq2ps_avx(auVar120);
          auVar121._0_4_ = fVar18 + fVar19 * auVar96._0_4_;
          auVar121._4_4_ = fVar18 + fVar19 * auVar96._4_4_;
          auVar121._8_4_ = fVar18 + fVar19 * auVar96._8_4_;
          auVar121._12_4_ = fVar18 + fVar19 * auVar96._12_4_;
          auVar121._16_4_ = fVar18 + fVar19 * auVar96._16_4_;
          auVar121._20_4_ = fVar18 + fVar19 * auVar96._20_4_;
          auVar121._24_4_ = fVar18 + fVar19 * auVar96._24_4_;
          auVar121._28_4_ = fVar18 + auVar96._28_4_;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = *(ulong *)((long)puVar30 + uVar44);
          auVar94 = vpmovzxbd_avx(auVar140);
          auVar153._8_8_ = 0;
          auVar153._0_8_ = *(ulong *)((long)puVar30 + uVar44 + 4);
          auVar113 = vpmovzxbd_avx(auVar153);
          auVar147._16_16_ = auVar113;
          auVar147._0_16_ = auVar94;
          auVar96 = vcvtdq2ps_avx(auVar147);
          auVar128._0_4_ = fVar18 + auVar96._0_4_ * fVar19;
          auVar128._4_4_ = fVar18 + auVar96._4_4_ * fVar19;
          auVar128._8_4_ = fVar18 + auVar96._8_4_ * fVar19;
          auVar128._12_4_ = fVar18 + auVar96._12_4_ * fVar19;
          auVar128._16_4_ = fVar18 + auVar96._16_4_ * fVar19;
          auVar128._20_4_ = fVar18 + auVar96._20_4_ * fVar19;
          auVar128._24_4_ = fVar18 + auVar96._24_4_ * fVar19;
          auVar128._28_4_ = fVar18 + fVar19;
          auVar130._8_8_ = 0;
          auVar130._0_8_ = puVar30[uVar33 + 4];
          auVar94 = vpmovzxbd_avx(auVar130);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = *(ulong *)((long)puVar30 + lVar1 + 0x24);
          auVar113 = vpmovzxbd_avx(auVar141);
          auVar136._16_16_ = auVar113;
          auVar136._0_16_ = auVar94;
          auVar142._8_8_ = 0;
          auVar142._0_8_ = *(ulong *)((long)puVar30 + uVar38);
          auVar94 = vpmovzxbd_avx(auVar142);
          auVar154._8_8_ = 0;
          auVar154._0_8_ = *(ulong *)((long)puVar30 + uVar38 + 4);
          auVar113 = vpmovzxbd_avx(auVar154);
          auVar148._16_16_ = auVar113;
          auVar148._0_16_ = auVar94;
          fVar18 = *(float *)((long)puVar30 + 0x44);
          auVar96 = vcvtdq2ps_avx(auVar136);
          auVar17 = vcvtdq2ps_avx(auVar148);
          fVar19 = *(float *)(puVar30 + 7);
          auVar137._0_4_ = fVar19 + fVar18 * auVar96._0_4_;
          auVar137._4_4_ = fVar19 + fVar18 * auVar96._4_4_;
          auVar137._8_4_ = fVar19 + fVar18 * auVar96._8_4_;
          auVar137._12_4_ = fVar19 + fVar18 * auVar96._12_4_;
          auVar137._16_4_ = fVar19 + fVar18 * auVar96._16_4_;
          auVar137._20_4_ = fVar19 + fVar18 * auVar96._20_4_;
          auVar137._24_4_ = fVar19 + fVar18 * auVar96._24_4_;
          auVar137._28_4_ = fVar19 + auVar96._28_4_;
          auVar149._0_4_ = fVar19 + fVar18 * auVar17._0_4_;
          auVar149._4_4_ = fVar19 + fVar18 * auVar17._4_4_;
          auVar149._8_4_ = fVar19 + fVar18 * auVar17._8_4_;
          auVar149._12_4_ = fVar19 + fVar18 * auVar17._12_4_;
          auVar149._16_4_ = fVar19 + fVar18 * auVar17._16_4_;
          auVar149._20_4_ = fVar19 + fVar18 * auVar17._20_4_;
          auVar149._24_4_ = fVar19 + fVar18 * auVar17._24_4_;
          auVar149._28_4_ = fVar19 + auVar17._28_4_;
          auVar96 = vsubps_avx(auVar97,auVar159._0_32_);
          auVar17._4_4_ = auVar175._4_4_ * auVar96._4_4_;
          auVar17._0_4_ = auVar175._0_4_ * auVar96._0_4_;
          auVar17._8_4_ = auVar175._8_4_ * auVar96._8_4_;
          auVar17._12_4_ = auVar175._12_4_ * auVar96._12_4_;
          auVar17._16_4_ = auVar175._16_4_ * auVar96._16_4_;
          auVar17._20_4_ = auVar175._20_4_ * auVar96._20_4_;
          auVar17._24_4_ = auVar175._24_4_ * auVar96._24_4_;
          auVar17._28_4_ = auVar96._28_4_;
          auVar96 = vsubps_avx(auVar121,auVar164._0_32_);
          auVar23._4_4_ = auVar183._4_4_ * auVar96._4_4_;
          auVar23._0_4_ = auVar183._0_4_ * auVar96._0_4_;
          auVar23._8_4_ = auVar183._8_4_ * auVar96._8_4_;
          auVar23._12_4_ = auVar183._12_4_ * auVar96._12_4_;
          auVar23._16_4_ = auVar183._16_4_ * auVar96._16_4_;
          auVar23._20_4_ = auVar183._20_4_ * auVar96._20_4_;
          auVar23._24_4_ = auVar183._24_4_ * auVar96._24_4_;
          auVar23._28_4_ = auVar96._28_4_;
          auVar96 = vmaxps_avx(auVar17,auVar23);
          auVar17 = vsubps_avx(auVar137,auVar169._0_32_);
          auVar24._4_4_ = auVar191._4_4_ * auVar17._4_4_;
          auVar24._0_4_ = auVar191._0_4_ * auVar17._0_4_;
          auVar24._8_4_ = auVar191._8_4_ * auVar17._8_4_;
          auVar24._12_4_ = auVar191._12_4_ * auVar17._12_4_;
          auVar24._16_4_ = auVar191._16_4_ * auVar17._16_4_;
          auVar24._20_4_ = auVar191._20_4_ * auVar17._20_4_;
          auVar24._24_4_ = auVar191._24_4_ * auVar17._24_4_;
          auVar24._28_4_ = auVar17._28_4_;
          auVar17 = vmaxps_avx(auVar24,local_23c0);
          local_25c0 = vmaxps_avx(auVar96,auVar17);
          auVar96 = vsubps_avx(auVar106,auVar159._0_32_);
          auVar25._4_4_ = auVar175._4_4_ * auVar96._4_4_;
          auVar25._0_4_ = auVar175._0_4_ * auVar96._0_4_;
          auVar25._8_4_ = auVar175._8_4_ * auVar96._8_4_;
          auVar25._12_4_ = auVar175._12_4_ * auVar96._12_4_;
          auVar25._16_4_ = auVar175._16_4_ * auVar96._16_4_;
          auVar25._20_4_ = auVar175._20_4_ * auVar96._20_4_;
          auVar25._24_4_ = auVar175._24_4_ * auVar96._24_4_;
          auVar25._28_4_ = auVar96._28_4_;
          auVar96 = vsubps_avx(auVar128,auVar164._0_32_);
          auVar26._4_4_ = auVar183._4_4_ * auVar96._4_4_;
          auVar26._0_4_ = auVar183._0_4_ * auVar96._0_4_;
          auVar26._8_4_ = auVar183._8_4_ * auVar96._8_4_;
          auVar26._12_4_ = auVar183._12_4_ * auVar96._12_4_;
          auVar26._16_4_ = auVar183._16_4_ * auVar96._16_4_;
          auVar26._20_4_ = auVar183._20_4_ * auVar96._20_4_;
          auVar26._24_4_ = auVar183._24_4_ * auVar96._24_4_;
          auVar26._28_4_ = auVar96._28_4_;
          auVar96 = vminps_avx(auVar25,auVar26);
          auVar17 = vsubps_avx(auVar149,auVar169._0_32_);
          auVar27._4_4_ = auVar191._4_4_ * auVar17._4_4_;
          auVar27._0_4_ = auVar191._0_4_ * auVar17._0_4_;
          auVar27._8_4_ = auVar191._8_4_ * auVar17._8_4_;
          auVar27._12_4_ = auVar191._12_4_ * auVar17._12_4_;
          auVar27._16_4_ = auVar191._16_4_ * auVar17._16_4_;
          auVar27._20_4_ = auVar191._20_4_ * auVar17._20_4_;
          auVar27._24_4_ = auVar191._24_4_ * auVar17._24_4_;
          auVar27._28_4_ = auVar17._28_4_;
          auVar17 = vminps_avx(auVar27,auVar52._0_32_);
          auVar17 = vminps_avx(auVar96,auVar17);
          auVar96 = vcmpps_avx(local_25c0,auVar17,2);
          auVar94 = vpcmpeqd_avx(auVar17._0_16_,auVar17._0_16_);
          auVar93 = vpmovsxbd_avx(auVar93 ^ auVar94);
          auVar56 = vpmovsxbd_avx(auVar56 ^ auVar94);
          auVar67._16_16_ = auVar56;
          auVar67._0_16_ = auVar93;
          auVar17 = vcvtdq2ps_avx(auVar67);
          auVar78._8_4_ = 0xbf800000;
          auVar78._0_8_ = 0xbf800000bf800000;
          auVar78._12_4_ = 0xbf800000;
          auVar78._16_4_ = 0xbf800000;
          auVar78._20_4_ = 0xbf800000;
          auVar78._24_4_ = 0xbf800000;
          auVar78._28_4_ = 0xbf800000;
          auVar17 = vcmpps_avx(auVar78,auVar17,1);
          auVar96 = vandps_avx(auVar96,auVar17);
          uVar29 = vmovmskps_avx(auVar96);
          if (uVar29 == 0) goto LAB_00e72257;
          uVar29 = uVar29 & 0xff;
          lVar35 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          uVar34 = *(ulong *)(uVar43 + lVar35 * 8);
          uVar29 = uVar29 - 1 & uVar29;
          if (uVar29 != 0) {
            uVar6 = *(uint *)(local_25c0 + lVar35 * 4);
            lVar35 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            uVar8 = *(ulong *)(uVar43 + lVar35 * 8);
            uVar7 = *(uint *)(local_25c0 + lVar35 * 4);
            uVar29 = uVar29 - 1 & uVar29;
            uVar36 = local_26e0;
            if (uVar29 == 0) {
              if (uVar6 < uVar7) {
                *(ulong *)*local_26e8 = uVar8;
                *(uint *)(*local_26e8 + 8) = uVar7;
                local_26e8 = local_26e8 + 1;
              }
              else {
                *(ulong *)*local_26e8 = uVar34;
                *(uint *)(*local_26e8 + 8) = uVar6;
                local_26e8 = local_26e8 + 1;
                uVar34 = uVar8;
              }
            }
            else {
              auVar57._8_8_ = 0;
              auVar57._0_8_ = uVar34;
              auVar93 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar6));
              auVar72._8_8_ = 0;
              auVar72._0_8_ = uVar8;
              auVar56 = vpunpcklqdq_avx(auVar72,ZEXT416(uVar7));
              lVar35 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              auVar84._8_8_ = 0;
              auVar84._0_8_ = *(ulong *)(uVar43 + lVar35 * 8);
              auVar113 = vpunpcklqdq_avx(auVar84,ZEXT416(*(uint *)(local_25c0 + lVar35 * 4)));
              auVar94 = vpcmpgtd_avx(auVar56,auVar93);
              uVar29 = uVar29 - 1 & uVar29;
              if (uVar29 == 0) {
                auVar80 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar56,auVar93,auVar80);
                auVar93 = vblendvps_avx(auVar93,auVar56,auVar80);
                auVar56 = vpcmpgtd_avx(auVar113,auVar94);
                auVar80 = vpshufd_avx(auVar56,0xaa);
                auVar56 = vblendvps_avx(auVar113,auVar94,auVar80);
                auVar94 = vblendvps_avx(auVar94,auVar113,auVar80);
                auVar113 = vpcmpgtd_avx(auVar94,auVar93);
                auVar80 = vpshufd_avx(auVar113,0xaa);
                auVar113 = vblendvps_avx(auVar94,auVar93,auVar80);
                auVar93 = vblendvps_avx(auVar93,auVar94,auVar80);
                *local_26e8 = auVar93;
                local_26e8[1] = auVar113;
                uVar34 = auVar56._0_8_;
                local_26e8 = local_26e8 + 2;
              }
              else {
                lVar35 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                  }
                }
                auVar116._8_8_ = 0;
                auVar116._0_8_ = *(ulong *)(uVar43 + lVar35 * 8);
                auVar80 = vpunpcklqdq_avx(auVar116,ZEXT416(*(uint *)(local_25c0 + lVar35 * 4)));
                uVar29 = uVar29 - 1 & uVar29;
                uVar34 = (ulong)uVar29;
                if (uVar29 == 0) {
                  auVar81 = vpshufd_avx(auVar94,0xaa);
                  auVar94 = vblendvps_avx(auVar56,auVar93,auVar81);
                  auVar93 = vblendvps_avx(auVar93,auVar56,auVar81);
                  auVar56 = vpcmpgtd_avx(auVar80,auVar113);
                  auVar81 = vpshufd_avx(auVar56,0xaa);
                  auVar56 = vblendvps_avx(auVar80,auVar113,auVar81);
                  auVar113 = vblendvps_avx(auVar113,auVar80,auVar81);
                  auVar80 = vpcmpgtd_avx(auVar113,auVar93);
                  auVar81 = vpshufd_avx(auVar80,0xaa);
                  auVar80 = vblendvps_avx(auVar113,auVar93,auVar81);
                  auVar93 = vblendvps_avx(auVar93,auVar113,auVar81);
                  auVar113 = vpcmpgtd_avx(auVar56,auVar94);
                  auVar81 = vpshufd_avx(auVar113,0xaa);
                  auVar113 = vblendvps_avx(auVar56,auVar94,auVar81);
                  auVar56 = vblendvps_avx(auVar94,auVar56,auVar81);
                  auVar94 = vpcmpgtd_avx(auVar80,auVar56);
                  auVar81 = vpshufd_avx(auVar94,0xaa);
                  auVar94 = vblendvps_avx(auVar80,auVar56,auVar81);
                  auVar56 = vblendvps_avx(auVar56,auVar80,auVar81);
                  *local_26e8 = auVar93;
                  local_26e8[1] = auVar56;
                  local_26e8[2] = auVar94;
                  local_26e8 = local_26e8 + 3;
                  uVar34 = auVar113._0_8_;
                }
                else {
                  *local_26e8 = auVar93;
                  local_26e8[1] = auVar56;
                  local_26e8[2] = auVar113;
                  pauVar31 = local_26e8 + 3;
                  local_26e8[3] = auVar80;
                  do {
                    lVar35 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                      }
                    }
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = *(ulong *)(uVar43 + lVar35 * 8);
                    auVar93 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_25c0 + lVar35 * 4)));
                    pauVar31[1] = auVar93;
                    pauVar31 = pauVar31 + 1;
                    uVar34 = uVar34 & uVar34 - 1;
                  } while (uVar34 != 0);
                  lVar35 = 0;
                  while (pauVar31 != local_26e8) {
                    auVar93 = local_26e8[1];
                    uVar29 = vextractps_avx(auVar93,2);
                    for (lVar39 = 0x10;
                        (lVar35 != lVar39 && (*(uint *)(local_26e8[-1] + lVar39 + 8) < uVar29));
                        lVar39 = lVar39 + -0x10) {
                      *(undefined1 (*) [16])(*local_26e8 + lVar39) =
                           *(undefined1 (*) [16])(local_26e8[-1] + lVar39);
                    }
                    *(undefined1 (*) [16])(*local_26e8 + lVar39) = auVar93;
                    lVar35 = lVar35 + -0x10;
                    local_26e8 = local_26e8 + 1;
                  }
                  uVar34 = *(ulong *)*pauVar31;
                  local_26e8 = pauVar31;
                  context = local_26b0;
                  ray = local_26b8;
                  uVar41 = local_26c0;
                }
              }
            }
          }
        }
        local_2650 = (ulong)((uint)uVar34 & 0xf) - 8;
        uVar34 = uVar34 & 0xfffffffffffffff0;
        for (local_2648 = 0; local_2648 != local_2650; local_2648 = local_2648 + 1) {
          lVar35 = local_2648 * 0x50;
          pSVar40 = context->scene;
          ppfVar9 = (pSVar40->vertices).items;
          pfVar10 = ppfVar9[*(uint *)(uVar34 + 0x30 + lVar35)];
          pfVar11 = ppfVar9[*(uint *)(uVar34 + 0x34 + lVar35)];
          pfVar12 = ppfVar9[*(uint *)(uVar34 + 0x38 + lVar35)];
          pfVar13 = ppfVar9[*(uint *)(uVar34 + 0x3c + lVar35)];
          auVar94 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar34 + lVar35)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar34 + 8 + lVar35)));
          auVar93 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar34 + lVar35)),
                                  *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar34 + 8 + lVar35)));
          auVar113 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar34 + 4 + lVar35)),
                                   *(undefined1 (*) [16])
                                    (pfVar13 + *(uint *)(uVar34 + 0xc + lVar35)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar34 + 4 + lVar35)),
                                  *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar34 + 0xc + lVar35))
                                 );
          auVar81 = vunpcklps_avx(auVar93,auVar56);
          auVar114 = vunpcklps_avx(auVar94,auVar113);
          auVar93 = vunpckhps_avx(auVar94,auVar113);
          auVar113 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar34 + 0x10 + lVar35)),
                                   *(undefined1 (*) [16])
                                    (pfVar12 + *(uint *)(uVar34 + 0x18 + lVar35)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar34 + 0x10 + lVar35)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar34 + 0x18 + lVar35)));
          auVar80 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar34 + 0x14 + lVar35)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar34 + 0x1c + lVar35)));
          auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar34 + 0x14 + lVar35)),
                                  *(undefined1 (*) [16])
                                   (pfVar13 + *(uint *)(uVar34 + 0x1c + lVar35)));
          auVar82 = vunpcklps_avx(auVar56,auVar94);
          auVar83 = vunpcklps_avx(auVar113,auVar80);
          auVar56 = vunpckhps_avx(auVar113,auVar80);
          auVar80 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar34 + 0x20 + lVar35)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar34 + 0x28 + lVar35)));
          auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar10 + *(uint *)(uVar34 + 0x20 + lVar35)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar34 + 0x28 + lVar35)));
          auVar103 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar34 + 0x24 + lVar35)),
                                   *(undefined1 (*) [16])
                                    (pfVar13 + *(uint *)(uVar34 + 0x2c + lVar35)));
          auVar113 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar34 + 0x24 + lVar35)),
                                   *(undefined1 (*) [16])
                                    (pfVar13 + *(uint *)(uVar34 + 0x2c + lVar35)));
          auVar115 = vunpcklps_avx(auVar94,auVar113);
          auVar113 = vunpcklps_avx(auVar80,auVar103);
          auVar80 = vunpckhps_avx(auVar80,auVar103);
          puVar2 = (undefined8 *)(uVar34 + 0x30 + lVar35);
          local_2490 = *puVar2;
          uStack_2488 = puVar2[1];
          puVar2 = (undefined8 *)(uVar34 + 0x40 + lVar35);
          local_25d0 = *puVar2;
          uStack_25c8 = puVar2[1];
          uVar32 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar155._4_4_ = uVar32;
          auVar155._0_4_ = uVar32;
          auVar155._8_4_ = uVar32;
          auVar155._12_4_ = uVar32;
          uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar174._4_4_ = uVar32;
          auVar174._0_4_ = uVar32;
          auVar174._8_4_ = uVar32;
          auVar174._12_4_ = uVar32;
          uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar181._4_4_ = uVar32;
          auVar181._0_4_ = uVar32;
          auVar181._8_4_ = uVar32;
          auVar181._12_4_ = uVar32;
          local_2660 = vsubps_avx(auVar114,auVar155);
          local_2670 = vsubps_avx(auVar93,auVar174);
          local_24a0 = vsubps_avx(auVar81,auVar181);
          auVar93 = vsubps_avx(auVar83,auVar155);
          auVar56 = vsubps_avx(auVar56,auVar174);
          auVar94 = vsubps_avx(auVar82,auVar181);
          auVar113 = vsubps_avx(auVar113,auVar155);
          auVar80 = vsubps_avx(auVar80,auVar174);
          auVar81 = vsubps_avx(auVar115,auVar181);
          local_24b0 = vsubps_avx(auVar113,local_2660);
          local_24c0 = vsubps_avx(auVar80,local_2670);
          local_24d0 = vsubps_avx(auVar81,local_24a0);
          fVar18 = local_2670._0_4_;
          fVar55 = auVar80._0_4_ + fVar18;
          fVar20 = local_2670._4_4_;
          fVar68 = auVar80._4_4_ + fVar20;
          fVar98 = local_2670._8_4_;
          fVar69 = auVar80._8_4_ + fVar98;
          fVar15 = local_2670._12_4_;
          fVar70 = auVar80._12_4_ + fVar15;
          fVar158 = local_24a0._0_4_;
          fVar101 = fVar158 + auVar81._0_4_;
          fVar160 = local_24a0._4_4_;
          fVar107 = fVar160 + auVar81._4_4_;
          fVar161 = local_24a0._8_4_;
          fVar109 = fVar161 + auVar81._8_4_;
          fVar162 = local_24a0._12_4_;
          fVar111 = fVar162 + auVar81._12_4_;
          fVar71 = local_24d0._0_4_;
          auVar143._0_4_ = fVar71 * fVar55;
          fVar79 = local_24d0._4_4_;
          auVar143._4_4_ = fVar79 * fVar68;
          fVar53 = local_24d0._8_4_;
          auVar143._8_4_ = fVar53 * fVar69;
          fVar54 = local_24d0._12_4_;
          auVar143._12_4_ = fVar54 * fVar70;
          fVar190 = local_24c0._0_4_;
          auVar156._0_4_ = fVar190 * fVar101;
          fVar192 = local_24c0._4_4_;
          auVar156._4_4_ = fVar192 * fVar107;
          fVar193 = local_24c0._8_4_;
          auVar156._8_4_ = fVar193 * fVar109;
          fVar194 = local_24c0._12_4_;
          auVar156._12_4_ = fVar194 * fVar111;
          auVar114 = vsubps_avx(auVar156,auVar143);
          fVar19 = local_2660._0_4_;
          fVar138 = auVar113._0_4_ + fVar19;
          fVar21 = local_2660._4_4_;
          fVar150 = auVar113._4_4_ + fVar21;
          fVar100 = local_2660._8_4_;
          fVar151 = auVar113._8_4_ + fVar100;
          fVar16 = local_2660._12_4_;
          fVar152 = auVar113._12_4_ + fVar16;
          fVar179 = local_24b0._0_4_;
          auVar104._0_4_ = fVar179 * fVar101;
          fVar184 = local_24b0._4_4_;
          auVar104._4_4_ = fVar184 * fVar107;
          fVar186 = local_24b0._8_4_;
          auVar104._8_4_ = fVar186 * fVar109;
          fVar188 = local_24b0._12_4_;
          auVar104._12_4_ = fVar188 * fVar111;
          auVar157._0_4_ = fVar138 * fVar71;
          auVar157._4_4_ = fVar150 * fVar79;
          auVar157._8_4_ = fVar151 * fVar53;
          auVar157._12_4_ = fVar152 * fVar54;
          auVar82 = vsubps_avx(auVar157,auVar104);
          auVar144._0_4_ = fVar190 * fVar138;
          auVar144._4_4_ = fVar192 * fVar150;
          auVar144._8_4_ = fVar193 * fVar151;
          auVar144._12_4_ = fVar194 * fVar152;
          auVar45._0_4_ = fVar179 * fVar55;
          auVar45._4_4_ = fVar184 * fVar68;
          auVar45._8_4_ = fVar186 * fVar69;
          auVar45._12_4_ = fVar188 * fVar70;
          auVar83 = vsubps_avx(auVar45,auVar144);
          local_26a0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_26d0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          fStack_2688 = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_2690 = (RTCIntersectArguments *)CONCAT44(fStack_2688,fStack_2688);
          fStack_2684 = fStack_2688;
          local_24f0._0_4_ =
               auVar114._0_4_ * fStack_2688 +
               local_26d0._4_4_ * auVar82._0_4_ + (float)local_26a0._4_4_ * auVar83._0_4_;
          local_24f0._4_4_ =
               auVar114._4_4_ * fStack_2688 +
               local_26d0._4_4_ * auVar82._4_4_ + (float)local_26a0._4_4_ * auVar83._4_4_;
          local_24f0._8_4_ =
               auVar114._8_4_ * fStack_2688 +
               local_26d0._4_4_ * auVar82._8_4_ + (float)local_26a0._4_4_ * auVar83._8_4_;
          local_24f0._12_4_ =
               auVar114._12_4_ * fStack_2688 +
               local_26d0._4_4_ * auVar82._12_4_ + (float)local_26a0._4_4_ * auVar83._12_4_;
          local_24e0 = vsubps_avx(local_2670,auVar56);
          auVar114 = vsubps_avx(local_24a0,auVar94);
          fVar55 = fVar18 + auVar56._0_4_;
          fVar68 = fVar20 + auVar56._4_4_;
          fVar69 = fVar98 + auVar56._8_4_;
          fVar70 = fVar15 + auVar56._12_4_;
          fVar101 = fVar158 + auVar94._0_4_;
          fVar107 = fVar160 + auVar94._4_4_;
          fVar109 = fVar161 + auVar94._8_4_;
          fVar111 = fVar162 + auVar94._12_4_;
          fVar163 = auVar114._0_4_;
          auVar182._0_4_ = fVar163 * fVar55;
          fVar165 = auVar114._4_4_;
          auVar182._4_4_ = fVar165 * fVar68;
          fVar166 = auVar114._8_4_;
          auVar182._8_4_ = fVar166 * fVar69;
          fVar167 = auVar114._12_4_;
          auVar182._12_4_ = fVar167 * fVar70;
          fVar173 = local_24e0._0_4_;
          auVar85._0_4_ = fVar173 * fVar101;
          fVar176 = local_24e0._4_4_;
          auVar85._4_4_ = fVar176 * fVar107;
          fVar177 = local_24e0._8_4_;
          auVar85._8_4_ = fVar177 * fVar109;
          fVar178 = local_24e0._12_4_;
          auVar85._12_4_ = fVar178 * fVar111;
          auVar114 = vsubps_avx(auVar85,auVar182);
          auVar82 = vsubps_avx(local_2660,auVar93);
          fVar180 = auVar82._0_4_;
          auVar105._0_4_ = fVar180 * fVar101;
          fVar185 = auVar82._4_4_;
          auVar105._4_4_ = fVar185 * fVar107;
          fVar187 = auVar82._8_4_;
          auVar105._8_4_ = fVar187 * fVar109;
          fVar189 = auVar82._12_4_;
          auVar105._12_4_ = fVar189 * fVar111;
          fVar101 = fVar19 + auVar93._0_4_;
          fVar107 = fVar21 + auVar93._4_4_;
          fVar109 = fVar100 + auVar93._8_4_;
          fVar111 = fVar16 + auVar93._12_4_;
          auVar145._0_4_ = fVar163 * fVar101;
          auVar145._4_4_ = fVar165 * fVar107;
          auVar145._8_4_ = fVar166 * fVar109;
          auVar145._12_4_ = fVar167 * fVar111;
          auVar82 = vsubps_avx(auVar145,auVar105);
          auVar131._0_4_ = fVar173 * fVar101;
          auVar131._4_4_ = fVar176 * fVar107;
          auVar131._8_4_ = fVar177 * fVar109;
          auVar131._12_4_ = fVar178 * fVar111;
          auVar46._0_4_ = fVar180 * fVar55;
          auVar46._4_4_ = fVar185 * fVar68;
          auVar46._8_4_ = fVar187 * fVar69;
          auVar46._12_4_ = fVar189 * fVar70;
          auVar83 = vsubps_avx(auVar46,auVar131);
          local_25c0._16_4_ =
               fStack_2688 * auVar114._0_4_ +
               local_26d0._4_4_ * auVar82._0_4_ + (float)local_26a0._4_4_ * auVar83._0_4_;
          local_25c0._20_4_ =
               fStack_2688 * auVar114._4_4_ +
               local_26d0._4_4_ * auVar82._4_4_ + (float)local_26a0._4_4_ * auVar83._4_4_;
          local_25c0._24_4_ =
               fStack_2688 * auVar114._8_4_ +
               local_26d0._4_4_ * auVar82._8_4_ + (float)local_26a0._4_4_ * auVar83._8_4_;
          local_25c0._28_4_ =
               fStack_2688 * auVar114._12_4_ +
               local_26d0._4_4_ * auVar82._12_4_ + (float)local_26a0._4_4_ * auVar83._12_4_;
          auVar114 = vsubps_avx(auVar93,auVar113);
          fVar150 = auVar113._0_4_ + auVar93._0_4_;
          fVar151 = auVar113._4_4_ + auVar93._4_4_;
          fVar152 = auVar113._8_4_ + auVar93._8_4_;
          fVar99 = auVar113._12_4_ + auVar93._12_4_;
          auVar93 = vsubps_avx(auVar56,auVar80);
          fVar107 = auVar56._0_4_ + auVar80._0_4_;
          fVar109 = auVar56._4_4_ + auVar80._4_4_;
          fVar111 = auVar56._8_4_ + auVar80._8_4_;
          fVar138 = auVar56._12_4_ + auVar80._12_4_;
          auVar56 = vsubps_avx(auVar94,auVar81);
          fVar68 = auVar94._0_4_ + auVar81._0_4_;
          fVar69 = auVar94._4_4_ + auVar81._4_4_;
          fVar70 = auVar94._8_4_ + auVar81._8_4_;
          fVar101 = auVar94._12_4_ + auVar81._12_4_;
          fVar102 = auVar56._0_4_;
          auVar117._0_4_ = fVar102 * fVar107;
          fVar108 = auVar56._4_4_;
          auVar117._4_4_ = fVar108 * fVar109;
          fVar110 = auVar56._8_4_;
          auVar117._8_4_ = fVar110 * fVar111;
          fVar112 = auVar56._12_4_;
          auVar117._12_4_ = fVar112 * fVar138;
          fVar168 = auVar93._0_4_;
          auVar132._0_4_ = fVar168 * fVar68;
          fVar170 = auVar93._4_4_;
          auVar132._4_4_ = fVar170 * fVar69;
          fVar171 = auVar93._8_4_;
          auVar132._8_4_ = fVar171 * fVar70;
          fVar172 = auVar93._12_4_;
          auVar132._12_4_ = fVar172 * fVar101;
          auVar93 = vsubps_avx(auVar132,auVar117);
          fVar55 = auVar114._0_4_;
          auVar59._0_4_ = fVar55 * fVar68;
          fVar68 = auVar114._4_4_;
          auVar59._4_4_ = fVar68 * fVar69;
          fVar69 = auVar114._8_4_;
          auVar59._8_4_ = fVar69 * fVar70;
          fVar70 = auVar114._12_4_;
          auVar59._12_4_ = fVar70 * fVar101;
          auVar133._0_4_ = fVar102 * fVar150;
          auVar133._4_4_ = fVar108 * fVar151;
          auVar133._8_4_ = fVar110 * fVar152;
          auVar133._12_4_ = fVar112 * fVar99;
          auVar56 = vsubps_avx(auVar133,auVar59);
          auVar86._0_4_ = fVar168 * fVar150;
          auVar86._4_4_ = fVar170 * fVar151;
          auVar86._8_4_ = fVar171 * fVar152;
          auVar86._12_4_ = fVar172 * fVar99;
          auVar73._0_4_ = fVar55 * fVar107;
          auVar73._4_4_ = fVar68 * fVar109;
          auVar73._8_4_ = fVar69 * fVar111;
          auVar73._12_4_ = fVar70 * fVar138;
          auVar94 = vsubps_avx(auVar73,auVar86);
          local_26a0._0_4_ = local_26a0._4_4_;
          fStack_2698 = (float)local_26a0._4_4_;
          fStack_2694 = (float)local_26a0._4_4_;
          local_26d0._0_4_ = local_26d0._4_4_;
          fStack_26c8 = local_26d0._4_4_;
          fStack_26c4 = local_26d0._4_4_;
          auVar60._0_4_ =
               fStack_2688 * auVar93._0_4_ +
               local_26d0._4_4_ * auVar56._0_4_ + (float)local_26a0._4_4_ * auVar94._0_4_;
          auVar60._4_4_ =
               fStack_2688 * auVar93._4_4_ +
               local_26d0._4_4_ * auVar56._4_4_ + (float)local_26a0._4_4_ * auVar94._4_4_;
          auVar60._8_4_ =
               fStack_2688 * auVar93._8_4_ +
               local_26d0._4_4_ * auVar56._8_4_ + (float)local_26a0._4_4_ * auVar94._8_4_;
          auVar60._12_4_ =
               fStack_2688 * auVar93._12_4_ +
               local_26d0._4_4_ * auVar56._12_4_ + (float)local_26a0._4_4_ * auVar94._12_4_;
          local_25a0._0_4_ = auVar60._0_4_ + local_24f0._0_4_ + local_25c0._16_4_;
          local_25a0._4_4_ = auVar60._4_4_ + local_24f0._4_4_ + local_25c0._20_4_;
          local_25a0._8_4_ = auVar60._8_4_ + local_24f0._8_4_ + local_25c0._24_4_;
          local_25a0._12_4_ = auVar60._12_4_ + local_24f0._12_4_ + local_25c0._28_4_;
          auVar93 = vminps_avx(local_24f0,local_25c0._16_16_);
          auVar93 = vminps_avx(auVar93,auVar60);
          auVar87._8_4_ = 0x7fffffff;
          auVar87._0_8_ = 0x7fffffff7fffffff;
          auVar87._12_4_ = 0x7fffffff;
          local_2500 = vandps_avx(local_25a0,auVar87);
          auVar88._0_4_ = local_2500._0_4_ * 1.1920929e-07;
          auVar88._4_4_ = local_2500._4_4_ * 1.1920929e-07;
          auVar88._8_4_ = local_2500._8_4_ * 1.1920929e-07;
          auVar88._12_4_ = local_2500._12_4_ * 1.1920929e-07;
          uVar36 = CONCAT44(auVar88._4_4_,auVar88._0_4_);
          auVar118._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar118._8_4_ = -auVar88._8_4_;
          auVar118._12_4_ = -auVar88._12_4_;
          auVar93 = vcmpps_avx(auVar93,auVar118,5);
          auVar56 = vmaxps_avx(local_24f0,local_25c0._16_16_);
          auVar56 = vmaxps_avx(auVar56,auVar60);
          auVar56 = vcmpps_avx(auVar56,auVar88,2);
          local_2510 = vorps_avx(auVar93,auVar56);
          local_26e9 = 0;
          auVar22._8_8_ = uStack_25d8;
          auVar22._0_8_ = local_25e0;
          auVar22 = auVar22 & local_2510;
          if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar22[0xf] < '\0') {
            auVar61._0_4_ = fVar71 * fVar173;
            auVar61._4_4_ = fVar79 * fVar176;
            auVar61._8_4_ = fVar53 * fVar177;
            auVar61._12_4_ = fVar54 * fVar178;
            auVar74._0_4_ = fVar190 * fVar163;
            auVar74._4_4_ = fVar192 * fVar165;
            auVar74._8_4_ = fVar193 * fVar166;
            auVar74._12_4_ = fVar194 * fVar167;
            auVar94 = vsubps_avx(auVar74,auVar61);
            auVar89._0_4_ = fVar163 * fVar168;
            auVar89._4_4_ = fVar165 * fVar170;
            auVar89._8_4_ = fVar166 * fVar171;
            auVar89._12_4_ = fVar167 * fVar172;
            auVar119._0_4_ = fVar173 * fVar102;
            auVar119._4_4_ = fVar176 * fVar108;
            auVar119._8_4_ = fVar177 * fVar110;
            auVar119._12_4_ = fVar178 * fVar112;
            auVar113 = vsubps_avx(auVar119,auVar89);
            auVar134._8_4_ = 0x7fffffff;
            auVar134._0_8_ = 0x7fffffff7fffffff;
            auVar134._12_4_ = 0x7fffffff;
            auVar93 = vandps_avx(auVar61,auVar134);
            auVar56 = vandps_avx(auVar89,auVar134);
            auVar93 = vcmpps_avx(auVar93,auVar56,1);
            local_2540 = vblendvps_avx(auVar113,auVar94,auVar93);
            auVar62._0_4_ = fVar180 * fVar102;
            auVar62._4_4_ = fVar185 * fVar108;
            auVar62._8_4_ = fVar187 * fVar110;
            auVar62._12_4_ = fVar189 * fVar112;
            auVar75._0_4_ = fVar71 * fVar180;
            auVar75._4_4_ = fVar79 * fVar185;
            auVar75._8_4_ = fVar53 * fVar187;
            auVar75._12_4_ = fVar54 * fVar189;
            auVar90._0_4_ = fVar179 * fVar163;
            auVar90._4_4_ = fVar184 * fVar165;
            auVar90._8_4_ = fVar186 * fVar166;
            auVar90._12_4_ = fVar188 * fVar167;
            auVar94 = vsubps_avx(auVar75,auVar90);
            auVar124._0_4_ = fVar163 * fVar55;
            auVar124._4_4_ = fVar165 * fVar68;
            auVar124._8_4_ = fVar166 * fVar69;
            auVar124._12_4_ = fVar167 * fVar70;
            auVar113 = vsubps_avx(auVar124,auVar62);
            auVar93 = vandps_avx(auVar90,auVar134);
            auVar56 = vandps_avx(auVar62,auVar134);
            auVar93 = vcmpps_avx(auVar93,auVar56,1);
            local_2530 = vblendvps_avx(auVar113,auVar94,auVar93);
            auVar47._0_4_ = fVar173 * fVar55;
            auVar47._4_4_ = fVar176 * fVar68;
            auVar47._8_4_ = fVar177 * fVar69;
            auVar47._12_4_ = fVar178 * fVar70;
            auVar76._0_4_ = fVar179 * fVar173;
            auVar76._4_4_ = fVar184 * fVar176;
            auVar76._8_4_ = fVar186 * fVar177;
            auVar76._12_4_ = fVar188 * fVar178;
            auVar91._0_4_ = fVar190 * fVar180;
            auVar91._4_4_ = fVar192 * fVar185;
            auVar91._8_4_ = fVar193 * fVar187;
            auVar91._12_4_ = fVar194 * fVar189;
            auVar125._0_4_ = fVar180 * fVar168;
            auVar125._4_4_ = fVar185 * fVar170;
            auVar125._8_4_ = fVar187 * fVar171;
            auVar125._12_4_ = fVar189 * fVar172;
            auVar94 = vsubps_avx(auVar76,auVar91);
            auVar113 = vsubps_avx(auVar125,auVar47);
            auVar93 = vandps_avx(auVar91,auVar134);
            auVar56 = vandps_avx(auVar47,auVar134);
            auVar93 = vcmpps_avx(auVar93,auVar56,1);
            local_2520 = vblendvps_avx(auVar113,auVar94,auVar93);
            fVar71 = local_2540._0_4_ * fStack_2688 +
                     local_2530._0_4_ * local_26d0._4_4_ +
                     local_2520._0_4_ * (float)local_26a0._4_4_;
            fVar55 = local_2540._4_4_ * fStack_2688 +
                     local_2530._4_4_ * local_26d0._4_4_ +
                     local_2520._4_4_ * (float)local_26a0._4_4_;
            fVar79 = local_2540._8_4_ * fStack_2688 +
                     local_2530._8_4_ * local_26d0._4_4_ +
                     local_2520._8_4_ * (float)local_26a0._4_4_;
            fVar68 = local_2540._12_4_ * fStack_2688 +
                     local_2530._12_4_ * local_26d0._4_4_ +
                     local_2520._12_4_ * (float)local_26a0._4_4_;
            auVar77._0_4_ = fVar71 + fVar71;
            auVar77._4_4_ = fVar55 + fVar55;
            auVar77._8_4_ = fVar79 + fVar79;
            auVar77._12_4_ = fVar68 + fVar68;
            fVar71 = local_2540._0_4_ * fVar19 +
                     local_2530._0_4_ * fVar18 + local_2520._0_4_ * fVar158;
            fVar55 = local_2540._4_4_ * fVar21 +
                     local_2530._4_4_ * fVar20 + local_2520._4_4_ * fVar160;
            fVar98 = local_2540._8_4_ * fVar100 +
                     local_2530._8_4_ * fVar98 + local_2520._8_4_ * fVar161;
            fVar100 = local_2540._12_4_ * fVar16 +
                      local_2530._12_4_ * fVar15 + local_2520._12_4_ * fVar162;
            auVar93 = vrcpps_avx(auVar77);
            fVar18 = auVar93._0_4_;
            auVar135._0_4_ = auVar77._0_4_ * fVar18;
            fVar19 = auVar93._4_4_;
            auVar135._4_4_ = auVar77._4_4_ * fVar19;
            fVar20 = auVar93._8_4_;
            auVar135._8_4_ = auVar77._8_4_ * fVar20;
            fVar21 = auVar93._12_4_;
            auVar135._12_4_ = auVar77._12_4_ * fVar21;
            auVar146._8_4_ = 0x3f800000;
            auVar146._0_8_ = 0x3f8000003f800000;
            auVar146._12_4_ = 0x3f800000;
            auVar93 = vsubps_avx(auVar146,auVar135);
            local_2550._0_4_ = (fVar71 + fVar71) * (fVar18 + fVar18 * auVar93._0_4_);
            local_2550._4_4_ = (fVar55 + fVar55) * (fVar19 + fVar19 * auVar93._4_4_);
            local_2550._8_4_ = (fVar98 + fVar98) * (fVar20 + fVar20 * auVar93._8_4_);
            local_2550._12_4_ = (fVar100 + fVar100) * (fVar21 + fVar21 * auVar93._12_4_);
            auVar52 = ZEXT1664(local_2550);
            uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar92._4_4_ = uVar32;
            auVar92._0_4_ = uVar32;
            auVar92._8_4_ = uVar32;
            auVar92._12_4_ = uVar32;
            auVar93 = vcmpps_avx(auVar92,local_2550,2);
            fVar18 = (ray->super_RayK<1>).tfar;
            auVar126._4_4_ = fVar18;
            auVar126._0_4_ = fVar18;
            auVar126._8_4_ = fVar18;
            auVar126._12_4_ = fVar18;
            auVar56 = vcmpps_avx(local_2550,auVar126,2);
            auVar93 = vandps_avx(auVar93,auVar56);
            auVar56 = vcmpps_avx(auVar77,_DAT_01f45a50,4);
            auVar93 = vandps_avx(auVar56,auVar93);
            auVar28._8_8_ = uStack_25d8;
            auVar28._0_8_ = local_25e0;
            auVar56 = vandps_avx(local_2510,auVar28);
            auVar93 = vpslld_avx(auVar93,0x1f);
            auVar94 = vpsrad_avx(auVar93,0x1f);
            auVar93 = auVar56 & auVar94;
            if ((((auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar93[0xf] < '\0') {
              auVar4._0_4_ = (ray->super_RayK<1>).tfar;
              auVar4._4_4_ = (ray->super_RayK<1>).mask;
              auVar4._8_4_ = (ray->super_RayK<1>).id;
              auVar4._12_4_ = (ray->super_RayK<1>).flags;
              auVar159 = ZEXT1664(auVar4);
              auVar56 = vandps_avx(auVar94,auVar56);
              local_25c0._0_16_ = local_24f0;
              local_2590 = &local_26e9;
              local_2580 = auVar56;
              local_2680 = auVar56;
              auVar93 = vrcpps_avx(local_25a0);
              fVar18 = auVar93._0_4_;
              auVar63._0_4_ = local_25a0._0_4_ * fVar18;
              fVar19 = auVar93._4_4_;
              auVar63._4_4_ = local_25a0._4_4_ * fVar19;
              fVar20 = auVar93._8_4_;
              auVar63._8_4_ = local_25a0._8_4_ * fVar20;
              fVar21 = auVar93._12_4_;
              auVar63._12_4_ = local_25a0._12_4_ * fVar21;
              auVar95._8_4_ = 0x3f800000;
              auVar95._0_8_ = 0x3f8000003f800000;
              auVar95._12_4_ = 0x3f800000;
              auVar93 = vsubps_avx(auVar95,auVar63);
              auVar48._0_4_ = fVar18 + fVar18 * auVar93._0_4_;
              auVar48._4_4_ = fVar19 + fVar19 * auVar93._4_4_;
              auVar48._8_4_ = fVar20 + fVar20 * auVar93._8_4_;
              auVar48._12_4_ = fVar21 + fVar21 * auVar93._12_4_;
              auVar64._8_4_ = 0x219392ef;
              auVar64._0_8_ = 0x219392ef219392ef;
              auVar64._12_4_ = 0x219392ef;
              auVar93 = vcmpps_avx(local_2500,auVar64,5);
              auVar93 = vandps_avx(auVar93,auVar48);
              auVar65._0_4_ = local_24f0._0_4_ * auVar93._0_4_;
              auVar65._4_4_ = local_24f0._4_4_ * auVar93._4_4_;
              auVar65._8_4_ = local_24f0._8_4_ * auVar93._8_4_;
              auVar65._12_4_ = local_24f0._12_4_ * auVar93._12_4_;
              local_2570 = vminps_avx(auVar65,auVar95);
              auVar49._0_4_ = local_25c0._16_4_ * auVar93._0_4_;
              auVar49._4_4_ = local_25c0._20_4_ * auVar93._4_4_;
              auVar49._8_4_ = local_25c0._24_4_ * auVar93._8_4_;
              auVar49._12_4_ = local_25c0._28_4_ * auVar93._12_4_;
              local_2560 = vminps_avx(auVar49,auVar95);
              auVar50._8_4_ = 0x7f800000;
              auVar50._0_8_ = 0x7f8000007f800000;
              auVar50._12_4_ = 0x7f800000;
              auVar93 = vblendvps_avx(auVar50,local_2550,auVar56);
              auVar94 = vshufps_avx(auVar93,auVar93,0xb1);
              auVar94 = vminps_avx(auVar94,auVar93);
              auVar113 = vshufpd_avx(auVar94,auVar94,1);
              auVar94 = vminps_avx(auVar113,auVar94);
              auVar93 = vcmpps_avx(auVar93,auVar94,0);
              auVar94 = auVar56 & auVar93;
              if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar94[0xf] < '\0') {
                auVar56 = vandps_avx(auVar93,auVar56);
              }
              uVar29 = vextractps_avx(auVar4,1);
              uVar32 = vmovmskps_avx(auVar56);
              uVar36 = CONCAT44((int)((ulong)pfVar13 >> 0x20),uVar32);
              lVar35 = 0;
              local_26d8 = pSVar40;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
LAB_00e72d35:
              local_2670 = auVar159._0_16_;
              local_25f8 = *(uint *)((long)&local_2490 + lVar35 * 4);
              pRVar37 = (RTCIntersectArguments *)(ulong)local_25f8;
              pGVar14 = (pSVar40->geometries).items[(long)pRVar37].ptr;
              if ((pGVar14->mask & uVar29) == 0) {
                *(undefined4 *)(local_2680 + lVar35 * 4) = 0;
              }
              else {
                local_2690 = context->args;
                if (context->args->filter == (RTCFilterFunctionN)0x0) {
                  local_2640.context = context->user;
                  if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar18 = *(float *)(local_2570 + lVar35 * 4);
                    fVar19 = *(float *)(local_2560 + lVar35 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2550 + lVar35 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_2540 + lVar35 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_2530 + lVar35 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_2520 + lVar35 * 4);
                    ray->u = fVar18;
                    ray->v = fVar19;
                    ray->primID = *(uint *)((long)&local_25d0 + lVar35 * 4);
                    ray->geomID = local_25f8;
                    ray->instID[0] = (local_2640.context)->instID[0];
                    ray->instPrimID[0] = (local_2640.context)->instPrimID[0];
                    goto LAB_00e730a6;
                  }
                }
                else {
                  local_2640.context = context->user;
                }
                local_2610 = *(float *)(local_2540 + lVar35 * 4);
                local_260c = *(undefined4 *)(local_2530 + lVar35 * 4);
                local_2608 = *(undefined4 *)(local_2520 + lVar35 * 4);
                local_2604 = *(undefined4 *)(local_2570 + lVar35 * 4);
                local_2600 = *(undefined4 *)(local_2560 + lVar35 * 4);
                local_25fc = *(undefined4 *)((long)&local_25d0 + lVar35 * 4);
                local_25f4 = (local_2640.context)->instID[0];
                local_25f0 = (local_2640.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_2550 + lVar35 * 4);
                local_26a4 = -1;
                local_2640.valid = &local_26a4;
                pRVar37 = (RTCIntersectArguments *)pGVar14->userPtr;
                local_2640.geometryUserPtr = pRVar37;
                local_2640.ray = (RTCRayN *)ray;
                local_2640.hit = (RTCHitN *)&local_2610;
                local_2640.N = 1;
                local_26d0 = (RTCIntersectArguments *)pGVar14;
                _local_26a0 = auVar52._0_16_;
                local_2660._0_8_ = lVar35;
                if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e72f2c:
                  if ((local_2690->filter != (RTCFilterFunctionN)0x0) &&
                     ((pRVar37 = local_2690,
                      (local_2690->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (pRVar37 = local_26d0,
                      ((ulong)local_26d0[1].intersect & 0x40000000000000) != 0)))) {
                    (*local_2690->filter)(&local_2640);
                    auVar52 = ZEXT1664(_local_26a0);
                    pSVar40 = local_26d8;
                    lVar35 = local_2660._0_8_;
                    context = local_26b0;
                    ray = local_26b8;
                    uVar41 = local_26c0;
                    if (*local_2640.valid == 0) goto LAB_00e72feb;
                  }
                  (((Vec3f *)((long)local_2640.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_2640.hit;
                  (((Vec3f *)((long)local_2640.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_2640.hit + 4);
                  (((Vec3f *)((long)local_2640.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_2640.hit + 8);
                  *(float *)((long)local_2640.ray + 0x3c) = *(float *)(local_2640.hit + 0xc);
                  *(float *)((long)local_2640.ray + 0x40) = *(float *)(local_2640.hit + 0x10);
                  *(float *)((long)local_2640.ray + 0x44) = *(float *)(local_2640.hit + 0x14);
                  *(float *)((long)local_2640.ray + 0x48) = *(float *)(local_2640.hit + 0x18);
                  *(float *)((long)local_2640.ray + 0x4c) = *(float *)(local_2640.hit + 0x1c);
                  pRVar37 = (RTCIntersectArguments *)0x0;
                  *(float *)((long)local_2640.ray + 0x50) = *(float *)(local_2640.hit + 0x20);
                }
                else {
                  (*pGVar14->intersectionFilterN)(&local_2640);
                  auVar52 = ZEXT1664(_local_26a0);
                  pSVar40 = local_26d8;
                  lVar35 = local_2660._0_8_;
                  context = local_26b0;
                  ray = local_26b8;
                  uVar41 = local_26c0;
                  if (*local_2640.valid != 0) goto LAB_00e72f2c;
LAB_00e72feb:
                  (local_26b8->super_RayK<1>).tfar = (float)local_2670._0_4_;
                  pSVar40 = local_26d8;
                  lVar35 = local_2660._0_8_;
                  context = local_26b0;
                  ray = local_26b8;
                  uVar41 = local_26c0;
                }
                *(undefined4 *)(local_2680 + lVar35 * 4) = 0;
                fVar18 = (ray->super_RayK<1>).tfar;
                auVar51._4_4_ = fVar18;
                auVar51._0_4_ = fVar18;
                auVar51._8_4_ = fVar18;
                auVar51._12_4_ = fVar18;
                auVar93 = vcmpps_avx(auVar52._0_16_,auVar51,2);
                local_2680 = vandps_avx(auVar93,local_2680);
                auVar5._0_4_ = (ray->super_RayK<1>).tfar;
                auVar5._4_4_ = (ray->super_RayK<1>).mask;
                auVar5._8_4_ = (ray->super_RayK<1>).id;
                auVar5._12_4_ = (ray->super_RayK<1>).flags;
                auVar159 = ZEXT1664(auVar5);
                uVar29 = vextractps_avx(auVar5,1);
              }
              if ((((local_2680 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2680 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2680 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2680[0xf]) goto LAB_00e730a6;
              auVar66._8_4_ = 0x7f800000;
              auVar66._0_8_ = 0x7f8000007f800000;
              auVar66._12_4_ = 0x7f800000;
              auVar93 = vblendvps_avx(auVar66,auVar52._0_16_,local_2680);
              auVar56 = vshufps_avx(auVar93,auVar93,0xb1);
              auVar56 = vminps_avx(auVar56,auVar93);
              auVar94 = vshufpd_avx(auVar56,auVar56,1);
              auVar56 = vminps_avx(auVar94,auVar56);
              auVar56 = vcmpps_avx(auVar93,auVar56,0);
              auVar94 = local_2680 & auVar56;
              auVar93 = local_2680;
              if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar94[0xf] < '\0') {
                auVar93 = vandps_avx(auVar56,local_2680);
              }
              uVar32 = vmovmskps_avx(auVar93);
              uVar36 = CONCAT44((int)((ulong)pRVar37 >> 0x20),uVar32);
              lVar35 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              goto LAB_00e72d35;
            }
          }
LAB_00e730a6:
          auVar159 = ZEXT3264(local_23e0);
          auVar164 = ZEXT3264(local_2400);
          auVar169 = ZEXT3264(local_2420);
          auVar175 = ZEXT3264(local_2440);
          auVar183 = ZEXT3264(local_2460);
          auVar191 = ZEXT3264(local_2480);
          uVar36 = local_26e0;
        }
        fVar18 = (ray->super_RayK<1>).tfar;
        auVar52 = ZEXT3264(CONCAT428(fVar18,CONCAT424(fVar18,CONCAT420(fVar18,CONCAT416(fVar18,
                                                  CONCAT412(fVar18,CONCAT48(fVar18,CONCAT44(fVar18,
                                                  fVar18))))))));
      }
      goto LAB_00e72257;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }